

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.hpp
# Opt level: O0

void __thiscall
duckdb::ColumnReader::
PlainSkipTemplatedInternal<duckdb::DecimalParquetValueConversion<int,true>,false,false>
          (ColumnReader *this,ByteBuffer *plain_data,uint8_t *defines,uint64_t num_values,
          idx_t row_offset)

{
  idx_t iVar1;
  long in_RCX;
  ByteBuffer *in_RSI;
  ulong in_R8;
  idx_t row_idx;
  ColumnReader *in_stack_ffffffffffffffb8;
  ByteBuffer *in_stack_ffffffffffffffc0;
  undefined8 local_30;
  
  iVar1 = DecimalParquetValueConversion<int,_true>::PlainConstantSize();
  local_30 = in_R8;
  if (iVar1 == 0) {
    for (; local_30 < in_R8 + in_RCX; local_30 = local_30 + 1) {
      DecimalParquetValueConversion<int,_true>::PlainSkip<false>
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    }
  }
  else {
    iVar1 = DecimalParquetValueConversion<int,_true>::PlainConstantSize();
    ByteBuffer::unsafe_inc(in_RSI,in_RCX * iVar1);
  }
  return;
}

Assistant:

void PlainSkipTemplatedInternal(ByteBuffer &plain_data, const uint8_t *__restrict defines,
	                                const uint64_t num_values, idx_t row_offset = 0) {
		if (!HAS_DEFINES && CONVERSION::PlainConstantSize() > 0) {
			if (CHECKED) {
				plain_data.inc(num_values * CONVERSION::PlainConstantSize());
			} else {
				plain_data.unsafe_inc(num_values * CONVERSION::PlainConstantSize());
			}
			return;
		}
		for (idx_t row_idx = row_offset; row_idx < row_offset + num_values; row_idx++) {
			if (HAS_DEFINES && defines[row_idx] != MaxDefine()) {
				continue;
			}
			CONVERSION::template PlainSkip<CHECKED>(plain_data, *this);
		}
	}